

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

BigNumber * __thiscall BigNumber::operator-(BigNumber *__return_storage_ptr__,BigNumber *this)

{
  int8_t *piVar1;
  int8_t *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  __return_storage_ptr__->sign = (bool)(this->sign ^ 1);
  uVar4 = (ulong)this->numOfDigits;
  __return_storage_ptr__->numOfDigits = this->numOfDigits;
  piVar2 = (int8_t *)operator_new__(uVar4);
  __return_storage_ptr__->numArray = piVar2;
  if (uVar4 != 0) {
    piVar1 = this->numArray;
    uVar3 = 0;
    do {
      piVar2[uVar3] = piVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber:: operator-() const{    //gharine kardan bigNumber
    BigNumber temp;
    temp.sign = !sign;
    temp.numOfDigits = numOfDigits;
    temp.numArray = new int8_t[numOfDigits];
    for( size_t i{0}; i < numOfDigits; ++i){
        temp.numArray[i] = numArray[i];
    }
    return temp;
}